

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ikfast61_kukakr10r1100sixx.cpp
# Opt level: O0

bool __thiscall
IKSolver::ComputeIk(IKSolver *this,IkReal *eetrans,IkReal *eerot,IkReal *pfree,
                   IkSolutionListBase<double> *solutions)

{
  int iVar1;
  undefined4 extraout_var;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  CheckValue<double> CVar15;
  CheckValue<double> CVar16;
  IkReal x648;
  IkReal x647;
  IkReal x646;
  IkReal x645;
  IkReal x644;
  IkReal x643;
  IkReal x642;
  IkReal x641;
  IkReal x640;
  IkReal x639;
  IkReal x638;
  IkReal evalcond_2 [5];
  int local_498;
  int local_494;
  int iij1_2;
  int ij1_2;
  CheckValue<double> x637;
  CheckValue<double> x636;
  IkReal x635;
  IkReal x634;
  IkReal x633;
  IkReal x632;
  IkReal x631;
  IkReal x630;
  double dStack_438;
  bool j1valid_2 [1];
  IkReal sj1array_2 [1];
  IkReal cj1array_2 [1];
  IkReal j1array_2 [1];
  IkReal x629;
  IkReal x628;
  IkReal x627;
  IkReal x626;
  IkReal x625;
  IkReal x624;
  IkReal x623;
  IkReal x622;
  IkReal x621;
  IkReal x620;
  IkReal x619;
  IkReal evalcond_1 [5];
  int iij1_1;
  int ij1_1;
  CheckValue<double> x618;
  CheckValue<double> x617;
  IkReal x616;
  IkReal x615;
  IkReal x614;
  IkReal x613;
  IkReal x612;
  IkReal x611;
  IkReal x610;
  double dStack_338;
  bool j1valid_1 [1];
  IkReal sj1array_1 [1];
  IkReal cj1array_1 [1];
  IkReal j1array_1 [1];
  IkReal x107;
  IkReal x106;
  IkReal x105;
  IkReal x104;
  IkReal x103;
  IkReal x102;
  IkReal x101;
  IkReal x100;
  IkReal x99;
  IkReal x98;
  IkReal x97;
  IkReal evalcond [5];
  int local_298;
  int local_294;
  int iij1;
  int ij1;
  CheckValue<double> x96;
  CheckValue<double> x95;
  IkReal x94;
  IkReal x93;
  IkReal x92;
  IkReal x91;
  IkReal x90;
  IkReal x89;
  IkReal x88;
  IkReal x87;
  IkReal x86;
  double dStack_220;
  bool j1valid [1];
  IkReal sj1array [1];
  IkReal cj1array [1];
  IkReal j1array [1];
  IkReal x85;
  IkReal x84;
  IkReal x83;
  IkReal x82;
  IkReal x81;
  IkReal x80;
  IkReal x79;
  IkReal x78;
  IkReal j1eval_2 [2];
  IkReal x77;
  IkReal x76;
  IkReal x75;
  IkReal x74;
  IkReal x73;
  IkReal x72;
  IkReal x71;
  IkReal x70;
  IkReal j1eval_1 [2];
  IkReal x69;
  IkReal x68;
  IkReal x67;
  IkReal x66;
  IkReal x65;
  IkReal x64;
  IkReal x63;
  IkReal x62;
  IkReal x61;
  IkReal x60;
  IkReal j1eval [3];
  int iij2;
  int ij2;
  IkReal x59;
  double dStack_e8;
  bool j2valid [2];
  IkReal sj2array [2];
  IkReal cj2array [2];
  IkReal j2array [2];
  int local_b0;
  int local_ac;
  int iij0;
  int ij0;
  IkReal x57;
  CheckValue<double> x58;
  bool j0valid [2];
  IkReal sj0array [2];
  IkReal cj0array [2];
  IkReal j0array [2];
  IkReal j0eval [1];
  IkReal x56;
  IkReal x55;
  IkReal x54;
  int dummyiter;
  IkSolutionListBase<double> *solutions_local;
  IkReal *pfree_local;
  IkReal *eerot_local;
  IkReal *eetrans_local;
  IKSolver *this_local;
  
  dVar2 = std::numeric_limits<double>::quiet_NaN();
  this->j0 = dVar2;
  this->_ij0[0] = 0xff;
  this->_ij0[1] = 0xff;
  this->_nj0 = 0xff;
  dVar2 = std::numeric_limits<double>::quiet_NaN();
  this->j1 = dVar2;
  this->_ij1[0] = 0xff;
  this->_ij1[1] = 0xff;
  this->_nj1 = 0xff;
  dVar2 = std::numeric_limits<double>::quiet_NaN();
  this->j2 = dVar2;
  this->_ij2[0] = 0xff;
  this->_ij2[1] = 0xff;
  this->_nj2 = 0xff;
  dVar2 = std::numeric_limits<double>::quiet_NaN();
  this->j3 = dVar2;
  this->_ij3[0] = 0xff;
  this->_ij3[1] = 0xff;
  this->_nj3 = 0xff;
  dVar2 = std::numeric_limits<double>::quiet_NaN();
  this->j4 = dVar2;
  this->_ij4[0] = 0xff;
  this->_ij4[1] = 0xff;
  this->_nj4 = 0xff;
  dVar2 = std::numeric_limits<double>::quiet_NaN();
  this->j5 = dVar2;
  this->_ij5[0] = 0xff;
  this->_ij5[1] = 0xff;
  this->_nj5 = 0xff;
  x54._4_4_ = 0;
  do {
    if (0 < x54._4_4_) {
      iVar1 = (*solutions->_vptr_IkSolutionListBase[4])();
      return CONCAT44(extraout_var,iVar1) != 0;
    }
    (*solutions->_vptr_IkSolutionListBase[5])();
    this->r00 = *eerot;
    this->r01 = eerot[1];
    this->r02 = eerot[2];
    this->r10 = eerot[3];
    this->r11 = eerot[4];
    this->r12 = eerot[5];
    this->r20 = eerot[6];
    this->r21 = eerot[7];
    this->r22 = eerot[8];
    this->px = *eetrans;
    this->py = eetrans[1];
    this->pz = eetrans[2];
    this->new_r00 = this->r02;
    this->new_r01 = this->r01;
    this->new_r02 = this->r00 * -1.0;
    this->new_px = this->r00 * -0.08 + this->px;
    this->new_r10 = this->r12 * -1.0;
    this->new_r11 = this->r11 * -1.0;
    this->new_r12 = this->r10;
    this->new_py = this->r10 * 0.08 - this->py;
    this->new_r20 = this->r22 * -1.0;
    this->new_r21 = this->r21 * -1.0;
    this->new_r22 = this->r20;
    this->new_pz = this->r20 * 0.08 + (0.4 - this->pz);
    this->r00 = this->new_r00;
    this->r01 = this->new_r01;
    this->r02 = this->new_r02;
    this->r10 = this->new_r10;
    this->r11 = this->new_r11;
    this->r12 = this->new_r12;
    this->r20 = this->new_r20;
    this->r21 = this->new_r21;
    this->r22 = this->new_r22;
    this->px = this->new_px;
    this->py = this->new_py;
    this->pz = this->new_pz;
    dVar2 = this->px * 1.0;
    dVar3 = this->pz * 1.0;
    dVar4 = this->py * 1.0;
    this->pp = this->pz * this->pz + this->px * this->px + this->py * this->py;
    this->npx = this->pz * this->r20 + this->px * this->r00 + this->py * this->r10;
    this->npy = this->pz * this->r21 + this->px * this->r01 + this->py * this->r11;
    this->npz = this->pz * this->r22 + this->px * this->r02 + this->py * this->r12;
    this->rxp0_0 = this->r20 * -1.0 * dVar4 + this->pz * this->r10;
    this->rxp0_1 = this->px * this->r20 + this->r00 * -1.0 * dVar3;
    this->rxp0_2 = this->r10 * -1.0 * dVar2 + this->py * this->r00;
    this->rxp1_0 = this->r21 * -1.0 * dVar4 + this->pz * this->r11;
    this->rxp1_1 = this->px * this->r21 + this->r01 * -1.0 * dVar3;
    this->rxp1_2 = this->r11 * -1.0 * dVar2 + this->py * this->r01;
    this->rxp2_0 = this->pz * this->r12 + this->r22 * -1.0 * dVar4;
    this->rxp2_1 = this->px * this->r22 + this->r02 * -1.0 * dVar3;
    this->rxp2_2 = this->r12 * -1.0 * dVar2 + this->py * this->r02;
    dVar2 = IKabs(this->px);
    dVar3 = IKabs(this->py);
    dVar2 = IKabs(dVar2 + dVar3);
    if (1e-06 <= dVar2) {
      memset(&x58.field_0xe,0,2);
      this->_nj0 = '\x02';
      CVar15 = IKatan2WithCheck<double>(this->py,this->px * -1.0,1e-07);
      x58.value._0_1_ = CVar15.valid;
      if (((undefined1  [16])CVar15 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        cj0array[1] = CVar15.value * -1.0;
        IKsin(cj0array[1]);
        sj0array[1] = IKcos(cj0array[1]);
        dVar2 = 3.14159265358979 - CVar15.value;
        sj0array[0] = IKsin(dVar2);
        cj0array[0] = IKcos(dVar2);
        if (cj0array[1] <= 3.14159265358979) {
          if (cj0array[1] < -3.14159265358979) {
            cj0array[1] = cj0array[1] + 6.28318530717959;
          }
        }
        else {
          cj0array[1] = cj0array[1] - 6.28318530717959;
        }
        x58._14_1_ = 1;
        x58._15_1_ = 1;
        for (local_ac = 0; local_ac < 2; local_ac = local_ac + 1) {
          if (((&x58.field_0xe)[local_ac] & 1) != 0) {
            this->_ij0[0] = (uchar)local_ac;
            this->_ij0[1] = 0xff;
            local_b0 = local_ac;
            do {
              local_b0 = local_b0 + 1;
              if (1 < local_b0) goto LAB_00146388;
            } while (((((&x58.field_0xe)[local_b0] & 1) == 0) ||
                     (dVar2 = IKabs(sj0array[(long)local_ac + 1] - sj0array[(long)local_b0 + 1]),
                     1e-06 <= dVar2)) ||
                    (dVar2 = IKabs(cj0array[(long)local_ac + -3] - cj0array[(long)local_b0 + -3]),
                    1e-06 <= dVar2));
            (&x58.field_0xe)[local_b0] = 0;
            this->_ij0[1] = (uchar)local_b0;
LAB_00146388:
            this->j0 = cj0array[(long)local_ac + 1];
            this->cj0 = sj0array[(long)local_ac + 1];
            this->sj0 = cj0array[(long)local_ac + -3];
            memset((void *)((long)&x59 + 6),0,2);
            this->_nj2 = '\x02';
            if ((-1.0000001 <=
                 this->cj0 * 0.0864856630609769 * this->px +
                 this->py * 0.0864856630609769 * this->sj0 +
                 this->pp * -1.72971326121954 + 1.00223910638213) &&
               (this->cj0 * 0.0864856630609769 * this->px +
                this->py * 0.0864856630609769 * this->sj0 +
                this->pp * -1.72971326121954 + 1.00223910638213 <= 1.0000001)) {
              dVar2 = IKasin(this->cj0 * 0.0864856630609769 * this->px +
                             this->py * 0.0864856630609769 * this->sj0 +
                             this->pp * -1.72971326121954 + 1.00223910638213);
              cj2array[1] = -1.50293950393859 - dVar2;
              dStack_e8 = IKsin(cj2array[1]);
              sj2array[1] = IKcos(cj2array[1]);
              sj2array[0] = IKsin(dVar2 + 1.6386531496512);
              cj2array[0] = IKcos(dVar2 + 1.6386531496512);
              if (cj2array[1] <= 3.14159265358979) {
                if (cj2array[1] < -3.14159265358979) {
                  cj2array[1] = cj2array[1] + 6.28318530717959;
                }
              }
              else {
                cj2array[1] = cj2array[1] - 6.28318530717959;
              }
              x59._6_1_ = 1;
              x59._7_1_ = 1;
              for (j1eval[2]._4_4_ = 0; j1eval[2]._4_4_ < 2; j1eval[2]._4_4_ = j1eval[2]._4_4_ + 1)
              {
                if ((*(byte *)((long)&x59 + (long)j1eval[2]._4_4_ + 6) & 1) != 0) {
                  this->_ij2[0] = (uchar)j1eval[2]._4_4_;
                  this->_ij2[1] = 0xff;
                  j1eval[2]._0_4_ = j1eval[2]._4_4_;
                  do {
                    j1eval[2]._0_4_ = j1eval[2]._0_4_ + 1;
                    if (1 < j1eval[2]._0_4_) goto LAB_001467a3;
                  } while ((((*(byte *)((long)&x59 + (long)j1eval[2]._0_4_ + 6) & 1) == 0) ||
                           (dVar2 = IKabs(sj2array[(long)j1eval[2]._4_4_ + 1] -
                                          sj2array[(long)j1eval[2]._0_4_ + 1]), 1e-06 <= dVar2)) ||
                          (dVar2 = IKabs(cj2array[(long)j1eval[2]._4_4_ + -3] -
                                         cj2array[(long)j1eval[2]._0_4_ + -3]), 1e-06 <= dVar2));
                  *(undefined1 *)((long)&x59 + (long)j1eval[2]._0_4_ + 6) = 0;
                  this->_ij2[1] = (uchar)j1eval[2]._0_4_;
LAB_001467a3:
                  this->j2 = cj2array[(long)j1eval[2]._4_4_ + 1];
                  this->cj2 = sj2array[(long)j1eval[2]._4_4_ + 1];
                  this->sj2 = cj2array[(long)j1eval[2]._4_4_ + -3];
                  dVar5 = this->cj2 * this->cj2;
                  dVar6 = this->cj0 * this->px;
                  dVar7 = this->cj2 * this->sj2;
                  dVar8 = this->sj2 * 0.515;
                  dVar9 = this->py * this->sj0;
                  dVar10 = this->cj2 * 40.0;
                  dVar11 = this->cj2 * 0.035;
                  dVar12 = this->sj2 * 588.571428571429;
                  dVar13 = this->cj2 * this->pz;
                  dVar14 = this->pz * this->sj2;
                  dVar2 = this->pz;
                  dVar3 = this->cj2;
                  dVar4 = this->sj2;
                  dVar8 = IKsign(this->cj2 * 0.000875 +
                                 dVar8 * dVar9 +
                                 dVar9 * -1.0 * dVar11 +
                                 dVar6 * dVar8 +
                                 dVar13 * 0.515 +
                                 dVar14 * 0.035 +
                                 this->sj2 * -0.012875 + dVar6 * -1.0 * dVar11 + this->pz * 0.56);
                  dVar11 = IKabs(dVar7 * 0.03605 + dVar5 * 0.264 + this->pz * this->pz + -0.265225);
                  dVar5 = IKabs(this->pz * -0.025 +
                                this->pz * dVar6 +
                                this->pz * dVar9 +
                                dVar7 * 0.264 +
                                this->cj2 * -0.0196 +
                                dVar5 * -0.03605 + this->sj2 * 0.2884 + 0.018025);
                  dVar2 = IKabs(dVar14 * 40.0 +
                                dVar9 * dVar12 +
                                dVar9 * -1.0 * dVar10 +
                                dVar13 * 588.571428571429 +
                                dVar4 * -14.7142857142857 +
                                dVar6 * dVar12 + dVar6 * -1.0 * dVar10 + dVar2 * 640.0 + dVar3);
                  if (((dVar2 < 1e-06) || (dVar2 = IKabs(dVar8), dVar2 < 1e-06)) ||
                     (dVar2 = IKabs(dVar11 + dVar5), dVar2 < 1e-06)) {
                    dVar4 = this->py * this->sj0;
                    dVar5 = this->sj2 * 40.0;
                    dVar6 = this->cj0 * this->px;
                    dVar7 = this->cj2 * this->pz;
                    dVar8 = this->sj2 * 0.035;
                    dVar9 = this->pz * this->sj2;
                    dVar10 = this->cj2 * 588.571428571429;
                    dVar11 = this->cj2 * 0.515;
                    dVar2 = this->sj2;
                    dVar3 = this->cj2;
                    dVar8 = IKsign(dVar6 * -1.0 * dVar11 +
                                   dVar6 * -1.0 * dVar8 +
                                   this->sj2 * 0.000875 +
                                   dVar7 * -0.035 +
                                   this->cj2 * 0.012875 +
                                   dVar4 * -0.56 +
                                   dVar6 * -0.56 +
                                   dVar4 * -1.0 * dVar8 +
                                   dVar4 * -1.0 * dVar11 + dVar9 * 0.515 + 0.014);
                    dVar2 = IKabs(dVar6 * -1.0 * dVar10 +
                                  dVar9 * 588.571428571429 +
                                  dVar6 * -640.0 +
                                  dVar4 * -640.0 +
                                  dVar5 * -1.0 * dVar6 +
                                  dVar7 * -40.0 +
                                  dVar3 * 14.7142857142857 +
                                  dVar4 * -1.0 * dVar5 + dVar4 * -1.0 * dVar10 + dVar2 + 16.0);
                    if ((dVar2 < 1e-06) || (dVar2 = IKabs(dVar8), dVar2 < 1e-06)) {
                      dVar2 = this->cj0 * this->cj0;
                      dVar3 = this->py * this->py;
                      dVar4 = this->pz * this->pz;
                      dVar5 = this->cj0 * this->px;
                      dVar6 = this->py * this->sj0;
                      dVar7 = dVar2 * this->px * this->px;
                      dVar8 = IKsign((((dVar2 * dVar3 +
                                       dVar5 * -2.0 * dVar6 +
                                       dVar5 * 0.05 + dVar6 * 0.05 + -0.000625) - dVar4) - dVar7) -
                                     dVar3);
                      dVar2 = IKabs((dVar4 * -1600.0 +
                                    dVar7 * -1600.0 +
                                    dVar5 * 80.0 +
                                    dVar6 * 80.0 +
                                    dVar5 * -3200.0 * dVar6 + dVar2 * dVar3 * 1600.0 + -1.0) -
                                    dVar3 * 1600.0);
                      if ((1e-06 <= dVar2) && (dVar2 = IKabs(dVar8), 1e-06 <= dVar2)) {
                        memset((void *)((long)&x86 + 7),0,1);
                        this->_nj1 = '\x01';
                        dVar2 = this->py * this->py;
                        dVar3 = this->cj0 * this->cj0;
                        dVar4 = this->cj0 * this->px;
                        dVar5 = this->sj2 * 0.515;
                        dVar6 = this->py * this->sj0;
                        dVar7 = this->cj2 * 0.035;
                        dVar8 = this->sj2 * 0.035;
                        dVar9 = this->cj2 * 0.515;
                        CVar15 = IKatan2WithCheck<double>
                                           (this->cj2 * 0.000875 +
                                            dVar4 * -1.0 * dVar7 +
                                            dVar4 * dVar5 +
                                            dVar6 * -1.0 * dVar7 +
                                            this->pz * -0.56 +
                                            dVar5 * dVar6 +
                                            this->sj2 * -0.012875 +
                                            this->pz * -1.0 * dVar8 + this->pz * -1.0 * dVar9,
                                            this->pz * -1.0 * dVar5 +
                                            dVar4 * -0.56 +
                                            dVar6 * -0.56 +
                                            dVar4 * -1.0 * dVar9 +
                                            dVar4 * -1.0 * dVar8 +
                                            this->sj2 * 0.000875 +
                                            this->pz * dVar7 +
                                            this->cj2 * 0.012875 +
                                            dVar6 * -1.0 * dVar8 + dVar6 * -1.0 * dVar9 + 0.014,
                                            1e-07);
                        if (((undefined1  [16])CVar15 & (undefined1  [16])0x1) !=
                            (undefined1  [16])0x0) {
                          dVar2 = IKsign(dVar3 * -1.0 * this->px * this->px +
                                         (((dVar4 * -2.0 * dVar6 +
                                           dVar2 * dVar3 + dVar6 * 0.05 + dVar4 * 0.05 + -0.000625)
                                          - dVar2) - this->pz * this->pz));
                          CVar16 = IKPowWithIntegerCheck<double>(dVar2,-1);
                          if (((undefined1  [16])CVar16 & (undefined1  [16])0x1) !=
                              (undefined1  [16])0x0) {
                            cj1array[0] = CVar16.value * 1.5707963267949 +
                                          CVar15.value + -1.5707963267949;
                            dStack_220 = IKsin(cj1array[0]);
                            sj1array[0] = IKcos(cj1array[0]);
                            if (cj1array[0] <= 3.14159265358979) {
                              if (cj1array[0] < -3.14159265358979) {
                                cj1array[0] = cj1array[0] + 6.28318530717959;
                              }
                            }
                            else {
                              cj1array[0] = cj1array[0] - 6.28318530717959;
                            }
                            x86._7_1_ = 1;
                            for (local_294 = 0; local_294 < 1; local_294 = local_294 + 1) {
                              if ((*(byte *)((long)&x86 + (long)local_294 + 7) & 1) != 0) {
                                this->_ij1[0] = (uchar)local_294;
                                this->_ij1[1] = 0xff;
                                local_298 = local_294;
                                do {
                                  local_298 = local_298 + 1;
                                  if (0 < local_298) goto LAB_0014773a;
                                } while ((((*(byte *)((long)&x86 + (long)local_298 + 7) & 1) == 0)
                                         || (dVar2 = IKabs(sj1array[local_294] - sj1array[local_298]
                                                          ), 1e-06 <= dVar2)) ||
                                        (dVar2 = IKabs(*(double *)
                                                        ((long)&stack0xfffffffffffffde0 +
                                                        (long)local_294 * 8) -
                                                       *(double *)
                                                        ((long)&stack0xfffffffffffffde0 +
                                                        (long)local_298 * 8)), 1e-06 <= dVar2));
                                *(undefined1 *)((long)&x86 + (long)local_298 + 7) = 0;
                                this->_ij1[1] = (uchar)local_298;
LAB_0014773a:
                                this->j1 = cj1array[local_294];
                                this->cj1 = sj1array[local_294];
                                this->sj1 = *(IkReal *)
                                             ((long)&stack0xfffffffffffffde0 + (long)local_294 * 8);
                                dVar4 = IKsin(this->j1);
                                dVar5 = IKcos(this->j1);
                                dVar6 = this->cj2 * 0.515;
                                dVar7 = this->cj0 * this->px;
                                dVar8 = this->sj2 * 0.515;
                                dVar9 = this->sj2 * 0.035;
                                dVar10 = this->py * this->sj0;
                                dVar11 = this->pz * 1.0;
                                dVar12 = this->cj2 * 0.035;
                                dVar2 = this->pp;
                                dVar3 = this->pz;
                                dVar13 = IKabs(dVar11 * -1.0 * dVar5 +
                                               dVar4 * -0.025 +
                                               ((dVar7 * dVar4 + dVar10 * dVar4) - dVar12) + dVar8);
                                if ((((dVar13 <= 1e-05) &&
                                     (dVar13 = IKabs(dVar11 * -1.0 * dVar4 +
                                                     dVar10 * -1.0 * dVar5 * 1.0 +
                                                     dVar5 * 0.025 +
                                                     dVar7 * -1.0 * dVar5 * 1.0 + 0.56 + dVar9 +
                                                     dVar6), dVar13 <= 1e-05)) &&
                                    (dVar11 = IKabs(dVar4 * 0.56 +
                                                    dVar12 * -1.0 * dVar5 +
                                                    dVar4 * dVar6 +
                                                    ((dVar9 * dVar4 + dVar8 * dVar5) - dVar11)),
                                    dVar11 <= 1e-05)) &&
                                   ((dVar2 = IKabs(dVar7 * dVar5 * 1.12 +
                                                   dVar7 * 0.05 +
                                                   dVar10 * 0.05 +
                                                   dVar3 * 1.12 * dVar4 +
                                                   dVar5 * -0.028 +
                                                   ((dVar10 * dVar5 * 1.12 + -0.047775) - dVar2)),
                                    dVar2 <= 1e-05 &&
                                    (dVar2 = IKabs(((dVar12 * dVar4 +
                                                    dVar5 * dVar6 +
                                                    dVar8 * -1.0 * dVar4 +
                                                    dVar5 * 0.56 + dVar9 * dVar5 + 0.025) - dVar10)
                                                   - dVar7), dVar2 <= 1e-05)))) {
                                  rotationfunction0(this,solutions);
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                    else {
                      memset((void *)((long)&x610 + 7),0,1);
                      this->_nj1 = '\x01';
                      dVar2 = this->cj2 * this->cj2;
                      dVar3 = this->cj2 * this->sj2;
                      dVar4 = this->py * this->sj0;
                      dVar5 = this->sj2 * 0.035;
                      dVar6 = this->cj0 * this->px;
                      dVar7 = this->pz * 1.0;
                      dVar8 = this->cj2 * 0.515;
                      CVar15 = IKatan2WithCheck<double>
                                         (this->cj2 * -0.0196 +
                                          dVar3 * 0.264 +
                                          dVar2 * -0.03605 +
                                          this->sj2 * 0.2884 +
                                          dVar6 * -1.0 * dVar7 +
                                          this->pz * 0.025 + dVar4 * -1.0 * dVar7 + 0.018025,
                                          this->sj2 * -0.0392 +
                                          this->cj2 * -0.5768 +
                                          this->pz * this->pz +
                                          dVar2 * -0.264 + dVar3 * -0.03605 + -0.314825,1e-07);
                      if (((undefined1  [16])CVar15 & (undefined1  [16])0x1) !=
                          (undefined1  [16])0x0) {
                        dVar2 = IKsign(dVar4 * -0.56 +
                                       dVar6 * -0.56 +
                                       this->sj2 * 0.000875 +
                                       dVar5 * -1.0 * dVar6 +
                                       this->cj2 * 0.012875 +
                                       this->pz * 0.515 * this->sj2 +
                                       this->cj2 * -0.035 * this->pz +
                                       dVar6 * -1.0 * dVar8 +
                                       dVar4 * -1.0 * dVar5 + dVar4 * -1.0 * dVar8 + 0.014);
                        CVar16 = IKPowWithIntegerCheck<double>(dVar2,-1);
                        if (((undefined1  [16])CVar16 & (undefined1  [16])0x1) !=
                            (undefined1  [16])0x0) {
                          cj1array_1[0] =
                               CVar16.value * 1.5707963267949 + CVar15.value + -1.5707963267949;
                          dStack_338 = IKsin(cj1array_1[0]);
                          sj1array_1[0] = IKcos(cj1array_1[0]);
                          if (cj1array_1[0] <= 3.14159265358979) {
                            if (cj1array_1[0] < -3.14159265358979) {
                              cj1array_1[0] = cj1array_1[0] + 6.28318530717959;
                            }
                          }
                          else {
                            cj1array_1[0] = cj1array_1[0] - 6.28318530717959;
                          }
                          x610._7_1_ = 1;
                          for (evalcond_1[4]._4_4_ = 0; evalcond_1[4]._4_4_ < 1;
                              evalcond_1[4]._4_4_ = evalcond_1[4]._4_4_ + 1) {
                            if ((*(byte *)((long)&x610 + (long)evalcond_1[4]._4_4_ + 7) & 1) != 0) {
                              this->_ij1[0] = (uchar)evalcond_1[4]._4_4_;
                              this->_ij1[1] = 0xff;
                              evalcond_1[4]._0_4_ = evalcond_1[4]._4_4_;
                              do {
                                evalcond_1[4]._0_4_ = evalcond_1[4]._0_4_ + 1;
                                if (0 < evalcond_1[4]._0_4_) goto LAB_00148163;
                              } while ((((*(byte *)((long)&x610 + (long)evalcond_1[4]._0_4_ + 7) & 1
                                         ) == 0) ||
                                       (dVar2 = IKabs(sj1array_1[evalcond_1[4]._4_4_] -
                                                      sj1array_1[evalcond_1[4]._0_4_]),
                                       1e-06 <= dVar2)) ||
                                      (dVar2 = IKabs(*(double *)
                                                      ((long)&stack0xfffffffffffffcc8 +
                                                      (long)evalcond_1[4]._4_4_ * 8) -
                                                     *(double *)
                                                      ((long)&stack0xfffffffffffffcc8 +
                                                      (long)evalcond_1[4]._0_4_ * 8)),
                                      1e-06 <= dVar2));
                              *(undefined1 *)((long)&x610 + (long)evalcond_1[4]._0_4_ + 7) = 0;
                              this->_ij1[1] = (uchar)evalcond_1[4]._0_4_;
LAB_00148163:
                              this->j1 = cj1array_1[evalcond_1[4]._4_4_];
                              this->cj1 = sj1array_1[evalcond_1[4]._4_4_];
                              this->sj1 = *(IkReal *)
                                           ((long)&stack0xfffffffffffffcc8 +
                                           (long)evalcond_1[4]._4_4_ * 8);
                              dVar4 = IKsin(this->j1);
                              dVar5 = IKcos(this->j1);
                              dVar6 = this->cj2 * 0.515;
                              dVar7 = this->cj0 * this->px;
                              dVar8 = this->sj2 * 0.515;
                              dVar9 = this->sj2 * 0.035;
                              dVar10 = this->py * this->sj0;
                              dVar11 = this->pz * 1.0;
                              dVar12 = this->cj2 * 0.035;
                              dVar2 = this->pz;
                              dVar3 = this->pp;
                              dVar13 = IKabs(dVar4 * -0.025 +
                                             dVar5 * -1.0 * dVar11 +
                                             ((dVar4 * dVar10 + dVar4 * dVar7) - dVar12) + dVar8);
                              if ((((dVar13 <= 1e-05) &&
                                   (dVar13 = IKabs(dVar4 * -1.0 * dVar11 +
                                                   dVar10 * -1.0 * dVar5 * 1.0 +
                                                   dVar5 * 0.025 + dVar7 * -1.0 * dVar5 * 1.0 + 0.56
                                                   + dVar9 + dVar6), dVar13 <= 1e-05)) &&
                                  (dVar11 = IKabs(dVar5 * dVar8 +
                                                  dVar5 * -1.0 * dVar12 +
                                                  ((dVar4 * dVar6 + dVar4 * 0.56 + dVar4 * dVar9) -
                                                  dVar11)), dVar11 <= 1e-05)) &&
                                 ((dVar2 = IKabs(dVar7 * dVar5 * 1.12 +
                                                 ((dVar10 * dVar5 * 1.12 +
                                                  dVar2 * 1.12 * dVar4 +
                                                  dVar5 * -0.028 +
                                                  dVar7 * 0.05 + dVar10 * 0.05 + -0.047775) - dVar3)
                                                ), dVar2 <= 1e-05 &&
                                  (dVar2 = IKabs(dVar5 * dVar9 +
                                                 dVar5 * dVar6 +
                                                 (((dVar4 * -1.0 * dVar8 +
                                                   dVar5 * 0.56 + dVar4 * dVar12 + 0.025) - dVar7) -
                                                 dVar10)), dVar2 <= 1e-05)))) {
                                rotationfunction0(this,solutions);
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                  else {
                    memset((void *)((long)&x630 + 7),0,1);
                    this->_nj1 = '\x01';
                    dVar2 = this->cj2 * this->cj2;
                    dVar3 = this->cj0 * this->px;
                    dVar4 = this->cj2 * 0.035;
                    dVar5 = this->cj2 * this->sj2;
                    dVar6 = this->sj2 * 0.515;
                    dVar7 = this->py * this->sj0;
                    CVar15 = IKatan2WithCheck<double>
                                       (dVar2 * 0.264 +
                                        this->pz * this->pz + dVar5 * 0.03605 + -0.265225,
                                        this->pz * -0.025 +
                                        dVar5 * 0.264 +
                                        dVar2 * -0.03605 +
                                        this->cj2 * -0.0196 +
                                        this->sj2 * 0.2884 +
                                        this->pz * dVar7 + this->pz * dVar3 + 0.018025,1e-07);
                    if (((undefined1  [16])CVar15 & (undefined1  [16])0x1) != (undefined1  [16])0x0)
                    {
                      dVar2 = IKsign(dVar4 * -1.0 * dVar7 +
                                     this->cj2 * 0.000875 +
                                     this->pz * 0.035 * this->sj2 +
                                     dVar3 * dVar6 +
                                     this->cj2 * 0.515 * this->pz +
                                     dVar6 * dVar7 +
                                     dVar3 * -1.0 * dVar4 + this->pz * 0.56 + this->sj2 * -0.012875)
                      ;
                      CVar16 = IKPowWithIntegerCheck<double>(dVar2,-1);
                      if (((undefined1  [16])CVar16 & (undefined1  [16])0x1) !=
                          (undefined1  [16])0x0) {
                        cj1array_2[0] =
                             CVar16.value * 1.5707963267949 + CVar15.value + -1.5707963267949;
                        dStack_438 = IKsin(cj1array_2[0]);
                        sj1array_2[0] = IKcos(cj1array_2[0]);
                        if (cj1array_2[0] <= 3.14159265358979) {
                          if (cj1array_2[0] < -3.14159265358979) {
                            cj1array_2[0] = cj1array_2[0] + 6.28318530717959;
                          }
                        }
                        else {
                          cj1array_2[0] = cj1array_2[0] - 6.28318530717959;
                        }
                        x630._7_1_ = 1;
                        for (local_494 = 0; local_494 < 1; local_494 = local_494 + 1) {
                          if ((*(byte *)((long)&x630 + (long)local_494 + 7) & 1) != 0) {
                            this->_ij1[0] = (uchar)local_494;
                            this->_ij1[1] = 0xff;
                            local_498 = local_494;
                            do {
                              local_498 = local_498 + 1;
                              if (0 < local_498) goto LAB_00148b02;
                            } while ((((*(byte *)((long)&x630 + (long)local_498 + 7) & 1) == 0) ||
                                     (dVar2 = IKabs(sj1array_2[local_494] - sj1array_2[local_498]),
                                     1e-06 <= dVar2)) ||
                                    (dVar2 = IKabs(*(double *)
                                                    ((long)&stack0xfffffffffffffbc8 +
                                                    (long)local_494 * 8) -
                                                   *(double *)
                                                    ((long)&stack0xfffffffffffffbc8 +
                                                    (long)local_498 * 8)), 1e-06 <= dVar2));
                            *(undefined1 *)((long)&x630 + (long)local_498 + 7) = 0;
                            this->_ij1[1] = (uchar)local_498;
LAB_00148b02:
                            this->j1 = cj1array_2[local_494];
                            this->cj1 = sj1array_2[local_494];
                            this->sj1 = *(IkReal *)
                                         ((long)&stack0xfffffffffffffbc8 + (long)local_494 * 8);
                            dVar4 = IKsin(this->j1);
                            dVar5 = IKcos(this->j1);
                            dVar6 = this->cj2 * 0.515;
                            dVar7 = this->cj0 * this->px;
                            dVar8 = this->sj2 * 0.515;
                            dVar9 = this->sj2 * 0.035;
                            dVar10 = this->py * this->sj0;
                            dVar11 = this->pz * 1.0;
                            dVar12 = this->cj2 * 0.035;
                            dVar2 = this->pp;
                            dVar3 = this->pz;
                            dVar13 = IKabs(((dVar5 * -1.0 * dVar11 +
                                            dVar4 * -0.025 + dVar4 * dVar10 + dVar4 * dVar7) -
                                           dVar12) + dVar8);
                            if ((((dVar13 <= 1e-05) &&
                                 (dVar13 = IKabs(dVar4 * -1.0 * dVar11 +
                                                 dVar10 * -1.0 * dVar5 * 1.0 +
                                                 dVar5 * 0.025 + dVar7 * -1.0 * dVar5 * 1.0 + 0.56 +
                                                 dVar9 + dVar6), dVar13 <= 1e-05)) &&
                                (dVar11 = IKabs(dVar4 * 0.56 +
                                                ((dVar5 * -1.0 * dVar12 +
                                                 dVar5 * dVar8 + dVar4 * dVar9 + dVar4 * dVar6) -
                                                dVar11)), dVar11 <= 1e-05)) &&
                               ((dVar2 = IKabs(dVar10 * 0.05 +
                                               dVar7 * 0.05 +
                                               dVar3 * 1.12 * dVar4 +
                                               ((dVar7 * dVar5 * 1.12 +
                                                dVar10 * dVar5 * 1.12 + dVar5 * -0.028 + -0.047775)
                                               - dVar2)), dVar2 <= 1e-05 &&
                                (dVar2 = IKabs(dVar4 * -1.0 * dVar8 +
                                               dVar5 * 0.56 +
                                               dVar5 * dVar6 +
                                               dVar5 * dVar9 +
                                               (((dVar4 * dVar12 + 0.025) - dVar7) - dVar10)),
                                dVar2 <= 1e-05)))) {
                              rotationfunction0(this,solutions);
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
    x54._4_4_ = x54._4_4_ + 1;
  } while( true );
}

Assistant:

bool ComputeIk(const IkReal* eetrans, const IkReal* eerot, const IkReal* pfree, IkSolutionListBase<IkReal>& solutions) {
j0=numeric_limits<IkReal>::quiet_NaN(); _ij0[0] = -1; _ij0[1] = -1; _nj0 = -1; j1=numeric_limits<IkReal>::quiet_NaN(); _ij1[0] = -1; _ij1[1] = -1; _nj1 = -1; j2=numeric_limits<IkReal>::quiet_NaN(); _ij2[0] = -1; _ij2[1] = -1; _nj2 = -1; j3=numeric_limits<IkReal>::quiet_NaN(); _ij3[0] = -1; _ij3[1] = -1; _nj3 = -1; j4=numeric_limits<IkReal>::quiet_NaN(); _ij4[0] = -1; _ij4[1] = -1; _nj4 = -1; j5=numeric_limits<IkReal>::quiet_NaN(); _ij5[0] = -1; _ij5[1] = -1; _nj5 = -1; 
for(int dummyiter = 0; dummyiter < 1; ++dummyiter) {
    solutions.Clear();
r00 = eerot[0*3+0];
r01 = eerot[0*3+1];
r02 = eerot[0*3+2];
r10 = eerot[1*3+0];
r11 = eerot[1*3+1];
r12 = eerot[1*3+2];
r20 = eerot[2*3+0];
r21 = eerot[2*3+1];
r22 = eerot[2*3+2];
px = eetrans[0]; py = eetrans[1]; pz = eetrans[2];

new_r00=r02;
new_r01=r01;
new_r02=((-1.0)*r00);
new_px=((((-0.08)*r00))+px);
new_r10=((-1.0)*r12);
new_r11=((-1.0)*r11);
new_r12=r10;
new_py=((((-1.0)*py))+(((0.08)*r10)));
new_r20=((-1.0)*r22);
new_r21=((-1.0)*r21);
new_r22=r20;
new_pz=((0.4)+(((-1.0)*pz))+(((0.08)*r20)));
r00 = new_r00; r01 = new_r01; r02 = new_r02; r10 = new_r10; r11 = new_r11; r12 = new_r12; r20 = new_r20; r21 = new_r21; r22 = new_r22; px = new_px; py = new_py; pz = new_pz;
IkReal x54=((1.0)*px);
IkReal x55=((1.0)*pz);
IkReal x56=((1.0)*py);
pp=((px*px)+(py*py)+(pz*pz));
npx=(((px*r00))+((py*r10))+((pz*r20)));
npy=(((px*r01))+((py*r11))+((pz*r21)));
npz=(((px*r02))+((py*r12))+((pz*r22)));
rxp0_0=((((-1.0)*r20*x56))+((pz*r10)));
rxp0_1=(((px*r20))+(((-1.0)*r00*x55)));
rxp0_2=((((-1.0)*r10*x54))+((py*r00)));
rxp1_0=((((-1.0)*r21*x56))+((pz*r11)));
rxp1_1=(((px*r21))+(((-1.0)*r01*x55)));
rxp1_2=((((-1.0)*r11*x54))+((py*r01)));
rxp2_0=(((pz*r12))+(((-1.0)*r22*x56)));
rxp2_1=(((px*r22))+(((-1.0)*r02*x55)));
rxp2_2=((((-1.0)*r12*x54))+((py*r02)));
{
IkReal j0eval[1];
j0eval[0]=((IKabs(px))+(IKabs(py)));
if( IKabs(j0eval[0]) < 0.0000010000000000  )
{
continue; // no branches [j0, j1, j2]

} else
{
{
IkReal j0array[2], cj0array[2], sj0array[2];
bool j0valid[2]={false};
_nj0 = 2;
CheckValue<IkReal> x58 = IKatan2WithCheck(IkReal(py),IkReal(((-1.0)*px)),IKFAST_ATAN2_MAGTHRESH);
if(!x58.valid){
continue;
}
IkReal x57=x58.value;
j0array[0]=((-1.0)*x57);
sj0array[0]=IKsin(j0array[0]);
cj0array[0]=IKcos(j0array[0]);
j0array[1]=((3.14159265358979)+(((-1.0)*x57)));
sj0array[1]=IKsin(j0array[1]);
cj0array[1]=IKcos(j0array[1]);
if( j0array[0] > IKPI )
{
    j0array[0]-=IK2PI;
}
else if( j0array[0] < -IKPI )
{    j0array[0]+=IK2PI;
}
j0valid[0] = true;
if( j0array[1] > IKPI )
{
    j0array[1]-=IK2PI;
}
else if( j0array[1] < -IKPI )
{    j0array[1]+=IK2PI;
}
j0valid[1] = true;
for(int ij0 = 0; ij0 < 2; ++ij0)
{
if( !j0valid[ij0] )
{
    continue;
}
_ij0[0] = ij0; _ij0[1] = -1;
for(int iij0 = ij0+1; iij0 < 2; ++iij0)
{
if( j0valid[iij0] && IKabs(cj0array[ij0]-cj0array[iij0]) < IKFAST_SOLUTION_THRESH && IKabs(sj0array[ij0]-sj0array[iij0]) < IKFAST_SOLUTION_THRESH )
{
    j0valid[iij0]=false; _ij0[1] = iij0; break; 
}
}
j0 = j0array[ij0]; cj0 = cj0array[ij0]; sj0 = sj0array[ij0];

{
IkReal j2array[2], cj2array[2], sj2array[2];
bool j2valid[2]={false};
_nj2 = 2;
if( (((1.00223910638213)+(((-1.72971326121954)*pp))+(((0.0864856630609769)*py*sj0))+(((0.0864856630609769)*cj0*px)))) < -1-IKFAST_SINCOS_THRESH || (((1.00223910638213)+(((-1.72971326121954)*pp))+(((0.0864856630609769)*py*sj0))+(((0.0864856630609769)*cj0*px)))) > 1+IKFAST_SINCOS_THRESH )
    continue;
IkReal x59=IKasin(((1.00223910638213)+(((-1.72971326121954)*pp))+(((0.0864856630609769)*py*sj0))+(((0.0864856630609769)*cj0*px))));
j2array[0]=((-1.50293950393859)+(((-1.0)*x59)));
sj2array[0]=IKsin(j2array[0]);
cj2array[0]=IKcos(j2array[0]);
j2array[1]=((1.6386531496512)+x59);
sj2array[1]=IKsin(j2array[1]);
cj2array[1]=IKcos(j2array[1]);
if( j2array[0] > IKPI )
{
    j2array[0]-=IK2PI;
}
else if( j2array[0] < -IKPI )
{    j2array[0]+=IK2PI;
}
j2valid[0] = true;
if( j2array[1] > IKPI )
{
    j2array[1]-=IK2PI;
}
else if( j2array[1] < -IKPI )
{    j2array[1]+=IK2PI;
}
j2valid[1] = true;
for(int ij2 = 0; ij2 < 2; ++ij2)
{
if( !j2valid[ij2] )
{
    continue;
}
_ij2[0] = ij2; _ij2[1] = -1;
for(int iij2 = ij2+1; iij2 < 2; ++iij2)
{
if( j2valid[iij2] && IKabs(cj2array[ij2]-cj2array[iij2]) < IKFAST_SOLUTION_THRESH && IKabs(sj2array[ij2]-sj2array[iij2]) < IKFAST_SOLUTION_THRESH )
{
    j2valid[iij2]=false; _ij2[1] = iij2; break; 
}
}
j2 = j2array[ij2]; cj2 = cj2array[ij2]; sj2 = sj2array[ij2];

{
IkReal j1eval[3];
IkReal x60=cj2*cj2;
IkReal x61=(cj0*px);
IkReal x62=(cj2*sj2);
IkReal x63=((0.515)*sj2);
IkReal x64=(py*sj0);
IkReal x65=((40.0)*cj2);
IkReal x66=((0.035)*cj2);
IkReal x67=((588.571428571429)*sj2);
IkReal x68=(cj2*pz);
IkReal x69=(pz*sj2);
j1eval[0]=((((-1.0)*x61*x65))+(((640.0)*pz))+cj2+((x61*x67))+(((-14.7142857142857)*sj2))+(((588.571428571429)*x68))+(((-1.0)*x64*x65))+((x64*x67))+(((40.0)*x69)));
j1eval[1]=IKsign(((((-1.0)*x61*x66))+(((0.56)*pz))+(((-0.012875)*sj2))+(((0.035)*x69))+(((0.515)*x68))+((x61*x63))+(((-1.0)*x64*x66))+((x63*x64))+(((0.000875)*cj2))));
j1eval[2]=((IKabs(((-0.265225)+(pz*pz)+(((0.264)*x60))+(((0.03605)*x62)))))+(IKabs(((0.018025)+(((0.2884)*sj2))+(((-0.03605)*x60))+(((-0.0196)*cj2))+(((0.264)*x62))+((pz*x64))+((pz*x61))+(((-0.025)*pz))))));
if( IKabs(j1eval[0]) < 0.0000010000000000  || IKabs(j1eval[1]) < 0.0000010000000000  || IKabs(j1eval[2]) < 0.0000010000000000  )
{
{
IkReal j1eval[2];
IkReal x70=(py*sj0);
IkReal x71=((40.0)*sj2);
IkReal x72=(cj0*px);
IkReal x73=(cj2*pz);
IkReal x74=((0.035)*sj2);
IkReal x75=(pz*sj2);
IkReal x76=((588.571428571429)*cj2);
IkReal x77=((0.515)*cj2);
j1eval[0]=((16.0)+sj2+(((-1.0)*x70*x76))+(((-1.0)*x70*x71))+(((14.7142857142857)*cj2))+(((-40.0)*x73))+(((-1.0)*x71*x72))+(((-640.0)*x70))+(((-640.0)*x72))+(((588.571428571429)*x75))+(((-1.0)*x72*x76)));
j1eval[1]=IKsign(((0.014)+(((0.515)*x75))+(((-1.0)*x70*x77))+(((-1.0)*x70*x74))+(((-0.56)*x72))+(((-0.56)*x70))+(((0.012875)*cj2))+(((-0.035)*x73))+(((0.000875)*sj2))+(((-1.0)*x72*x74))+(((-1.0)*x72*x77))));
if( IKabs(j1eval[0]) < 0.0000010000000000  || IKabs(j1eval[1]) < 0.0000010000000000  )
{
{
IkReal j1eval[2];
IkReal x78=cj0*cj0;
IkReal x79=py*py;
IkReal x80=px*px;
IkReal x81=pz*pz;
IkReal x82=(cj0*px);
IkReal x83=(py*sj0);
IkReal x84=((1600.0)*x79);
IkReal x85=(x78*x80);
j1eval[0]=((-1.0)+((x78*x84))+(((-3200.0)*x82*x83))+(((80.0)*x83))+(((80.0)*x82))+(((-1600.0)*x85))+(((-1600.0)*x81))+(((-1.0)*x84)));
j1eval[1]=IKsign(((-0.000625)+(((0.05)*x83))+(((0.05)*x82))+(((-2.0)*x82*x83))+((x78*x79))+(((-1.0)*x81))+(((-1.0)*x85))+(((-1.0)*x79))));
if( IKabs(j1eval[0]) < 0.0000010000000000  || IKabs(j1eval[1]) < 0.0000010000000000  )
{
continue; // no branches [j1]

} else
{
{
IkReal j1array[1], cj1array[1], sj1array[1];
bool j1valid[1]={false};
_nj1 = 1;
IkReal x86=py*py;
IkReal x87=cj0*cj0;
IkReal x88=(cj0*px);
IkReal x89=((0.515)*sj2);
IkReal x90=(py*sj0);
IkReal x91=((0.035)*cj2);
IkReal x92=((0.035)*sj2);
IkReal x93=((0.515)*cj2);
IkReal x94=(sj2*x90);
CheckValue<IkReal> x95 = IKatan2WithCheck(IkReal(((((-1.0)*pz*x92))+(((-1.0)*pz*x93))+(((-0.012875)*sj2))+((x89*x90))+(((-0.56)*pz))+(((-1.0)*x90*x91))+((x88*x89))+(((-1.0)*x88*x91))+(((0.000875)*cj2)))),IkReal(((0.014)+(((-1.0)*x90*x93))+(((-1.0)*x90*x92))+(((0.012875)*cj2))+((pz*x91))+(((0.000875)*sj2))+(((-1.0)*x88*x92))+(((-1.0)*x88*x93))+(((-0.56)*x90))+(((-0.56)*x88))+(((-1.0)*pz*x89)))),IKFAST_ATAN2_MAGTHRESH);
if(!x95.valid){
continue;
}
CheckValue<IkReal> x96=IKPowWithIntegerCheck(IKsign(((-0.000625)+(((0.05)*x88))+(((0.05)*x90))+((x86*x87))+(((-2.0)*x88*x90))+(((-1.0)*x86))+(((-1.0)*(pz*pz)))+(((-1.0)*x87*(px*px))))),-1);
if(!x96.valid){
continue;
}
j1array[0]=((-1.5707963267949)+(x95.value)+(((1.5707963267949)*(x96.value))));
sj1array[0]=IKsin(j1array[0]);
cj1array[0]=IKcos(j1array[0]);
if( j1array[0] > IKPI )
{
    j1array[0]-=IK2PI;
}
else if( j1array[0] < -IKPI )
{    j1array[0]+=IK2PI;
}
j1valid[0] = true;
for(int ij1 = 0; ij1 < 1; ++ij1)
{
if( !j1valid[ij1] )
{
    continue;
}
_ij1[0] = ij1; _ij1[1] = -1;
for(int iij1 = ij1+1; iij1 < 1; ++iij1)
{
if( j1valid[iij1] && IKabs(cj1array[ij1]-cj1array[iij1]) < IKFAST_SOLUTION_THRESH && IKabs(sj1array[ij1]-sj1array[iij1]) < IKFAST_SOLUTION_THRESH )
{
    j1valid[iij1]=false; _ij1[1] = iij1; break; 
}
}
j1 = j1array[ij1]; cj1 = cj1array[ij1]; sj1 = sj1array[ij1];
{
IkReal evalcond[5];
IkReal x97=IKsin(j1);
IkReal x98=IKcos(j1);
IkReal x99=((0.515)*cj2);
IkReal x100=(cj0*px);
IkReal x101=((0.515)*sj2);
IkReal x102=((0.035)*sj2);
IkReal x103=(py*sj0);
IkReal x104=((1.0)*pz);
IkReal x105=((0.035)*cj2);
IkReal x106=((1.0)*x98);
IkReal x107=((1.12)*x98);
evalcond[0]=(((x100*x97))+((x103*x97))+(((-1.0)*x105))+x101+(((-0.025)*x97))+(((-1.0)*x104*x98)));
evalcond[1]=((0.56)+(((-1.0)*x100*x106))+(((0.025)*x98))+x102+x99+(((-1.0)*x103*x106))+(((-1.0)*x104*x97)));
evalcond[2]=(((x102*x97))+((x101*x98))+(((-1.0)*x104))+((x97*x99))+(((-1.0)*x105*x98))+(((0.56)*x97)));
evalcond[3]=((-0.047775)+((x103*x107))+(((-1.0)*pp))+(((-0.028)*x98))+(((1.12)*pz*x97))+(((0.05)*x103))+(((0.05)*x100))+((x100*x107)));
evalcond[4]=((0.025)+((x102*x98))+(((0.56)*x98))+(((-1.0)*x101*x97))+((x98*x99))+((x105*x97))+(((-1.0)*x103))+(((-1.0)*x100)));
if( IKabs(evalcond[0]) > IKFAST_EVALCOND_THRESH  || IKabs(evalcond[1]) > IKFAST_EVALCOND_THRESH  || IKabs(evalcond[2]) > IKFAST_EVALCOND_THRESH  || IKabs(evalcond[3]) > IKFAST_EVALCOND_THRESH  || IKabs(evalcond[4]) > IKFAST_EVALCOND_THRESH  )
{
continue;
}
}

rotationfunction0(solutions);
}
}

}

}

} else
{
{
IkReal j1array[1], cj1array[1], sj1array[1];
bool j1valid[1]={false};
_nj1 = 1;
IkReal x610=cj2*cj2;
IkReal x611=(cj2*sj2);
IkReal x612=(py*sj0);
IkReal x613=((0.035)*sj2);
IkReal x614=(cj0*px);
IkReal x615=((1.0)*pz);
IkReal x616=((0.515)*cj2);
CheckValue<IkReal> x617 = IKatan2WithCheck(IkReal(((0.018025)+(((-1.0)*x612*x615))+(((0.025)*pz))+(((-1.0)*x614*x615))+(((0.2884)*sj2))+(((-0.03605)*x610))+(((0.264)*x611))+(((-0.0196)*cj2)))),IkReal(((-0.314825)+(((-0.03605)*x611))+(((-0.264)*x610))+(pz*pz)+(((-0.5768)*cj2))+(((-0.0392)*sj2)))),IKFAST_ATAN2_MAGTHRESH);
if(!x617.valid){
continue;
}
CheckValue<IkReal> x618=IKPowWithIntegerCheck(IKsign(((0.014)+(((-1.0)*x612*x616))+(((-1.0)*x612*x613))+(((-1.0)*x614*x616))+(((-0.035)*cj2*pz))+(((0.515)*pz*sj2))+(((0.012875)*cj2))+(((-1.0)*x613*x614))+(((0.000875)*sj2))+(((-0.56)*x614))+(((-0.56)*x612)))),-1);
if(!x618.valid){
continue;
}
j1array[0]=((-1.5707963267949)+(x617.value)+(((1.5707963267949)*(x618.value))));
sj1array[0]=IKsin(j1array[0]);
cj1array[0]=IKcos(j1array[0]);
if( j1array[0] > IKPI )
{
    j1array[0]-=IK2PI;
}
else if( j1array[0] < -IKPI )
{    j1array[0]+=IK2PI;
}
j1valid[0] = true;
for(int ij1 = 0; ij1 < 1; ++ij1)
{
if( !j1valid[ij1] )
{
    continue;
}
_ij1[0] = ij1; _ij1[1] = -1;
for(int iij1 = ij1+1; iij1 < 1; ++iij1)
{
if( j1valid[iij1] && IKabs(cj1array[ij1]-cj1array[iij1]) < IKFAST_SOLUTION_THRESH && IKabs(sj1array[ij1]-sj1array[iij1]) < IKFAST_SOLUTION_THRESH )
{
    j1valid[iij1]=false; _ij1[1] = iij1; break; 
}
}
j1 = j1array[ij1]; cj1 = cj1array[ij1]; sj1 = sj1array[ij1];
{
IkReal evalcond[5];
IkReal x619=IKsin(j1);
IkReal x620=IKcos(j1);
IkReal x621=((0.515)*cj2);
IkReal x622=(cj0*px);
IkReal x623=((0.515)*sj2);
IkReal x624=((0.035)*sj2);
IkReal x625=(py*sj0);
IkReal x626=((1.0)*pz);
IkReal x627=((0.035)*cj2);
IkReal x628=((1.0)*x620);
IkReal x629=((1.12)*x620);
evalcond[0]=(((x619*x625))+((x619*x622))+(((-1.0)*x627))+(((-1.0)*x620*x626))+(((-0.025)*x619))+x623);
evalcond[1]=((0.56)+(((-1.0)*x622*x628))+(((0.025)*x620))+(((-1.0)*x625*x628))+x624+x621+(((-1.0)*x619*x626)));
evalcond[2]=((((0.56)*x619))+((x619*x624))+((x619*x621))+(((-1.0)*x626))+(((-1.0)*x620*x627))+((x620*x623)));
evalcond[3]=((-0.047775)+(((0.05)*x625))+(((0.05)*x622))+(((-0.028)*x620))+(((1.12)*pz*x619))+((x625*x629))+(((-1.0)*pp))+((x622*x629)));
evalcond[4]=((0.025)+((x619*x627))+(((0.56)*x620))+(((-1.0)*x619*x623))+(((-1.0)*x622))+(((-1.0)*x625))+((x620*x621))+((x620*x624)));
if( IKabs(evalcond[0]) > IKFAST_EVALCOND_THRESH  || IKabs(evalcond[1]) > IKFAST_EVALCOND_THRESH  || IKabs(evalcond[2]) > IKFAST_EVALCOND_THRESH  || IKabs(evalcond[3]) > IKFAST_EVALCOND_THRESH  || IKabs(evalcond[4]) > IKFAST_EVALCOND_THRESH  )
{
continue;
}
}

rotationfunction0(solutions);
}
}

}

}

} else
{
{
IkReal j1array[1], cj1array[1], sj1array[1];
bool j1valid[1]={false};
_nj1 = 1;
IkReal x630=cj2*cj2;
IkReal x631=(cj0*px);
IkReal x632=((0.035)*cj2);
IkReal x633=(cj2*sj2);
IkReal x634=((0.515)*sj2);
IkReal x635=(py*sj0);
CheckValue<IkReal> x636 = IKatan2WithCheck(IkReal(((-0.265225)+(((0.03605)*x633))+(pz*pz)+(((0.264)*x630)))),IkReal(((0.018025)+((pz*x631))+((pz*x635))+(((0.2884)*sj2))+(((-0.0196)*cj2))+(((-0.03605)*x630))+(((0.264)*x633))+(((-0.025)*pz)))),IKFAST_ATAN2_MAGTHRESH);
if(!x636.valid){
continue;
}
CheckValue<IkReal> x637=IKPowWithIntegerCheck(IKsign(((((0.56)*pz))+(((-0.012875)*sj2))+(((-1.0)*x631*x632))+((x634*x635))+(((0.515)*cj2*pz))+((x631*x634))+(((0.035)*pz*sj2))+(((0.000875)*cj2))+(((-1.0)*x632*x635)))),-1);
if(!x637.valid){
continue;
}
j1array[0]=((-1.5707963267949)+(x636.value)+(((1.5707963267949)*(x637.value))));
sj1array[0]=IKsin(j1array[0]);
cj1array[0]=IKcos(j1array[0]);
if( j1array[0] > IKPI )
{
    j1array[0]-=IK2PI;
}
else if( j1array[0] < -IKPI )
{    j1array[0]+=IK2PI;
}
j1valid[0] = true;
for(int ij1 = 0; ij1 < 1; ++ij1)
{
if( !j1valid[ij1] )
{
    continue;
}
_ij1[0] = ij1; _ij1[1] = -1;
for(int iij1 = ij1+1; iij1 < 1; ++iij1)
{
if( j1valid[iij1] && IKabs(cj1array[ij1]-cj1array[iij1]) < IKFAST_SOLUTION_THRESH && IKabs(sj1array[ij1]-sj1array[iij1]) < IKFAST_SOLUTION_THRESH )
{
    j1valid[iij1]=false; _ij1[1] = iij1; break; 
}
}
j1 = j1array[ij1]; cj1 = cj1array[ij1]; sj1 = sj1array[ij1];
{
IkReal evalcond[5];
IkReal x638=IKsin(j1);
IkReal x639=IKcos(j1);
IkReal x640=((0.515)*cj2);
IkReal x641=(cj0*px);
IkReal x642=((0.515)*sj2);
IkReal x643=((0.035)*sj2);
IkReal x644=(py*sj0);
IkReal x645=((1.0)*pz);
IkReal x646=((0.035)*cj2);
IkReal x647=((1.0)*x639);
IkReal x648=((1.12)*x639);
evalcond[0]=(((x638*x644))+((x638*x641))+(((-0.025)*x638))+(((-1.0)*x639*x645))+(((-1.0)*x646))+x642);
evalcond[1]=((0.56)+(((-1.0)*x641*x647))+(((0.025)*x639))+(((-1.0)*x644*x647))+x643+x640+(((-1.0)*x638*x645)));
evalcond[2]=(((x638*x643))+((x638*x640))+((x639*x642))+(((-1.0)*x639*x646))+(((-1.0)*x645))+(((0.56)*x638)));
evalcond[3]=((-0.047775)+(((-0.028)*x639))+((x644*x648))+((x641*x648))+(((-1.0)*pp))+(((1.12)*pz*x638))+(((0.05)*x641))+(((0.05)*x644)));
evalcond[4]=((0.025)+((x638*x646))+(((-1.0)*x641))+(((-1.0)*x644))+((x639*x643))+((x639*x640))+(((0.56)*x639))+(((-1.0)*x638*x642)));
if( IKabs(evalcond[0]) > IKFAST_EVALCOND_THRESH  || IKabs(evalcond[1]) > IKFAST_EVALCOND_THRESH  || IKabs(evalcond[2]) > IKFAST_EVALCOND_THRESH  || IKabs(evalcond[3]) > IKFAST_EVALCOND_THRESH  || IKabs(evalcond[4]) > IKFAST_EVALCOND_THRESH  )
{
continue;
}
}

rotationfunction0(solutions);
}
}

}

}
}
}
}
}

}

}
}
return solutions.GetNumSolutions()>0;
}